

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O3

void Hop_ManStartMemory(Hop_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x80;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x400);
  pVVar1->pArray = ppvVar2;
  p->vChunks = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x80;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x400);
  pVVar1->pArray = ppvVar2;
  p->vPages = pVVar1;
  return;
}

Assistant:

void Hop_ManStartMemory( Hop_Man_t * p )
{
    p->vChunks = Vec_PtrAlloc( 128 );
    p->vPages = Vec_PtrAlloc( 128 );
}